

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForIgnoredParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForIgnoredParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_e0 [48];
  undefined1 local_b0 [8];
  MockCheckedExpectedCall expectedCall;
  TEST_MockExpectedCall_toStringForIgnoredParameters_Test *this_local;
  
  expectedCall._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0,1);
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x20),"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)local_b0,(SimpleString *)(local_e0 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x20));
  MockCheckedExpectedCall::ignoreOtherParameters((MockCheckedExpectedCall *)local_b0);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_e0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_e0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"name -> all parameters ignored (expected 1 call, called 0 times)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x23b,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_e0);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForIgnoredParameters)
{
    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.ignoreOtherParameters();
    STRCMP_EQUAL("name -> all parameters ignored (expected 1 call, called 0 times)", expectedCall.callToString().asCharString());
}